

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O1

void __thiscall QSplitterHandle::paintEvent(QSplitterHandle *this,QPaintEvent *param_1)

{
  long lVar1;
  long lVar2;
  QPalette *pQVar3;
  QStyle *pQVar4;
  int iVar5;
  long in_FS_OFFSET;
  QPainter p;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined1 *local_48;
  undefined1 auStack_40 [16];
  QObject *pQStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_70,&(this->super_QWidget).super_QPaintDevice);
  auStack_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_30 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  auStack_40._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption((QStyleOption *)&local_68,0,0);
  local_58 = (undefined1  [16])QWidget::contentsRect(&this->super_QWidget);
  pQVar3 = QWidget::palette(&this->super_QWidget);
  QPalette::operator=((QPalette *)auStack_40,pQVar3);
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  iVar5 = (uint)(*(int *)(lVar2 + 0x260) == 1) << 7;
  uStack_60 = (undefined1 *)CONCAT44(uStack_60._4_4_,iVar5);
  if ((*(byte *)(lVar1 + 0x268) & 2) != 0) {
    uStack_60._0_2_ = CONCAT11(0x20,(char)iVar5);
  }
  if ((*(byte *)(lVar1 + 0x268) & 4) != 0) {
    uStack_60 = (undefined1 *)((ulong)uStack_60 | 4);
  }
  if ((((this->super_QWidget).data)->widget_attributes & 1) == 0) {
    uStack_60 = (undefined1 *)((ulong)uStack_60 | 1);
  }
  pQVar4 = QWidget::style(*(QWidget **)(lVar2 + 0x10));
  (**(code **)(*(long *)pQVar4 + 0xb8))
            (pQVar4,0x1c,(QStyleOption *)&local_68,(QPainter *)&local_70,
             *(undefined8 *)(lVar1 + 600));
  QStyleOption::~QStyleOption((QStyleOption *)&local_68);
  QPainter::~QPainter((QPainter *)&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSplitterHandle::paintEvent(QPaintEvent *)
{
    Q_D(QSplitterHandle);
    QPainter p(this);
    QStyleOption opt(0);
    opt.rect = contentsRect();
    opt.palette = palette();
    if (orientation() == Qt::Horizontal)
        opt.state = QStyle::State_Horizontal;
    else
        opt.state = QStyle::State_None;
    if (d->hover)
        opt.state |= QStyle::State_MouseOver;
    if (d->pressed)
        opt.state |= QStyle::State_Sunken;
    if (isEnabled())
        opt.state |= QStyle::State_Enabled;
    parentWidget()->style()->drawControl(QStyle::CE_Splitter, &opt, &p, d->s);
}